

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  bool bVar3;
  char *__s;
  long lVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  byte *pbVar7;
  char *pcVar8;
  string defineFlagVar;
  string dflag;
  string local_c8;
  string local_a8;
  cmLocalGenerator *local_88;
  long *local_80;
  char *local_78;
  long local_70 [2];
  string local_60;
  cmOutputConverter *local_40;
  _Rb_tree_node_base *local_38;
  
  local_80 = local_70;
  local_88 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"-D","");
  if (lang->_M_string_length != 0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_c8);
    __s = cmMakefile::GetDefinition(local_88->Makefile,&local_c8);
    pcVar8 = local_78;
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_80,0,pcVar8,(ulong)__s);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var6 = (defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(defines->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_38) {
    local_40 = &local_88->super_cmOutputConverter;
    do {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_80,local_78 + (long)local_80);
      bVar3 = cmState::UseWatcomWMake(local_88->GlobalGenerator->CMakeInstance->State);
      p_Var1 = p_Var6 + 1;
      if (bVar3) {
        pbVar7 = *(byte **)p_Var1;
        do {
          if (*pbVar7 - 0x23 < 2) {
            std::__cxx11::string::push_back((char)&local_c8);
          }
          else if (*pbVar7 == 0) goto LAB_003e42c2;
          std::__cxx11::string::push_back((char)&local_c8);
          pbVar7 = pbVar7 + 1;
        } while( true );
      }
      lVar4 = std::__cxx11::string::find((char *)p_Var1,0x58a760,0);
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)p_Var1);
      std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (lVar4 != -1) {
        std::__cxx11::string::append((char *)&local_c8);
        lVar2 = *(long *)p_Var1;
        pcVar8 = (char *)(lVar4 + lVar2 + 1);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        sVar5 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,pcVar8,sVar5 + lVar2 + lVar4 + 1);
        cmOutputConverter::EscapeForShell(&local_a8,local_40,&local_60,true,false,false);
        std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
LAB_003e42c2:
      std::__cxx11::string::append((char *)definesString);
      std::__cxx11::string::_M_append((char *)definesString,(ulong)local_c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_38);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    std::string defineFlagVar = "CMAKE_";
    defineFlagVar += lang;
    defineFlagVar += "_DEFINE_FLAG";
    const char* df = this->Makefile->GetDefinition(defineFlagVar);
    if (df && *df) {
      dflag = df;
    }
  }

  std::set<std::string>::const_iterator defineIt = defines.begin();
  const std::set<std::string>::const_iterator defineEnd = defines.end();
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (; defineIt != defineEnd; ++defineIt) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (const char* c = defineIt->c_str(); *c; ++c) {
        if (*c == '$' || *c == '#') {
          def += '$';
        }
        def += *c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = defineIt->find("=");
      def += defineIt->substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(defineIt->c_str() + eq + 1, true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}